

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

char * js_strdup(JSContext *ctx,char *str)

{
  size_t n;
  char *pcVar1;
  
  n = strlen(str);
  pcVar1 = js_strndup(ctx,str,n);
  return pcVar1;
}

Assistant:

char *js_strdup(JSContext *ctx, const char *str)
{
    return js_strndup(ctx, str, strlen(str));
}